

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-knowledge.c
# Opt level: O0

void shape_lore_helper_append_to_list(char *item,char ***list,int *p_nmax,int *p_n)

{
  char **ppcVar1;
  char *pcVar2;
  int *p_n_local;
  int *p_nmax_local;
  char ***list_local;
  char *item_local;
  
  if (*p_nmax <= *p_n) {
    if (*p_nmax == 0) {
      *p_nmax = 4;
    }
    else {
      if (*p_nmax < 1) {
        __assert_fail("*p_nmax > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-knowledge.c"
                      ,0xa62,
                      "void shape_lore_helper_append_to_list(const char *, const char ***, int *, int *)"
                     );
      }
      *p_nmax = *p_nmax << 1;
    }
    ppcVar1 = (char **)mem_realloc(*list,(long)*p_nmax << 3);
    *list = ppcVar1;
  }
  pcVar2 = string_make(item);
  (*list)[*p_n] = pcVar2;
  *p_n = *p_n + 1;
  return;
}

Assistant:

static void shape_lore_helper_append_to_list(const char* item,
	const char ***list, int* p_nmax, int *p_n)
{
	if (*p_n >= *p_nmax) {
		if (*p_nmax == 0) {
			*p_nmax = 4;
		} else {
			assert(*p_nmax > 0);
			*p_nmax *= 2;
		}
		*list = mem_realloc(*list, *p_nmax * sizeof(**list));
	}
	(*list)[*p_n] = string_make(item);
	++*p_n;
}